

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

void decSetMaxValue(decNumber *dn,decContext *set)

{
  int local_24;
  uint8_t *puStack_20;
  int32_t count;
  uint8_t *up;
  decContext *set_local;
  decNumber *dn_local;
  
  local_24 = set->digits;
  dn->digits = local_24;
  puStack_20 = dn->lsu;
  for (; 1 < local_24; local_24 = local_24 + -1) {
    *puStack_20 = '\t';
    puStack_20 = puStack_20 + 1;
  }
  *puStack_20 = (char)DECPOWERS[local_24] + 0xff;
  dn->bits = '\0';
  dn->exponent = (set->emax - set->digits) + 1;
  return;
}

Assistant:

static void decSetMaxValue(decNumber *dn, decContext *set) {
  Unit *up;                        /* work  */
  Int count=set->digits;           /* nines to add  */
  dn->digits=count;
  /* fill in all nines to set maximum value  */
  for (up=dn->lsu; ; up++) {
    if (count>DECDPUN) *up=DECDPUNMAX;  /* unit full o'nines  */
     else {                             /* this is the msu  */
      *up=(Unit)(powers[count]-1);
      break;
      }
    count-=DECDPUN;                /* filled those digits  */
    } /* up  */
  dn->bits=0;                      /* + sign  */
  dn->exponent=set->emax-set->digits+1;
  }